

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cpp
# Opt level: O0

int __thiscall llvm::sys::unicode::columnWidthUTF8(unicode *this,StringRef Text)

{
  UTF8 first;
  uint uVar1;
  ConversionResult CVar2;
  int iVar3;
  UTF32 *pUStack_68;
  int Width;
  UTF32 *Target;
  UTF8 *Start;
  char *pcStack_50;
  UTF32 buf [1];
  size_t e;
  size_t i;
  uint Length;
  uint ColumnWidth;
  StringRef Text_local;
  
  pcStack_50 = Text.Data;
  i._4_4_ = 0;
  e = 0;
  _Length = this;
  Text_local.Data = pcStack_50;
  while( true ) {
    if (pcStack_50 <= e) {
      return i._4_4_;
    }
    first = StringRef::operator[]((StringRef *)&Length,e);
    uVar1 = getNumBytesForUTF8(first);
    if ((uVar1 == 0) || (Text_local.Data < (char *)(e + uVar1))) {
      return -2;
    }
    Target = (UTF32 *)(_Length + e);
    pUStack_68 = (UTF32 *)((long)&Start + 4);
    CVar2 = ConvertUTF8toUTF32((UTF8 **)&Target,(UTF8 *)((long)Target + (ulong)uVar1),
                               &stack0xffffffffffffff98,(UTF32 *)&stack0xffffffffffffffb0,
                               strictConversion);
    if (CVar2 != conversionOK) {
      return -2;
    }
    iVar3 = charWidth(Start._4_4_);
    if (iVar3 < 0) break;
    i._4_4_ = iVar3 + i._4_4_;
    e = uVar1 + e;
  }
  return -1;
}

Assistant:

int columnWidthUTF8(StringRef Text) {
  unsigned ColumnWidth = 0;
  unsigned Length;
  for (size_t i = 0, e = Text.size(); i < e; i += Length) {
    Length = getNumBytesForUTF8(Text[i]);
    if (Length <= 0 || i + Length > Text.size())
      return ErrorInvalidUTF8;
    UTF32 buf[1];
    const UTF8 *Start = reinterpret_cast<const UTF8 *>(Text.data() + i);
    UTF32 *Target = &buf[0];
    if (conversionOK != ConvertUTF8toUTF32(&Start, Start + Length, &Target,
                                           Target + 1, strictConversion))
      return ErrorInvalidUTF8;
    int Width = charWidth(buf[0]);
    if (Width < 0)
      return ErrorNonPrintableCharacter;
    ColumnWidth += Width;
  }
  return ColumnWidth;
}